

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O3

void __thiscall
Gudhi::ripser::
Compressed_sparse_matrix_<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
::push_back(Compressed_sparse_matrix_<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
            *this,diameter_entry_t e)

{
  pointer *ppdVar1;
  pointer puVar2;
  iterator __position;
  logic_error *this_00;
  diameter_entry_t local_20;
  
  local_20.
  super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
  .second = e.
            super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
            .second.content;
  local_20.
  super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
  .first = e.
           super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
           .first;
  if ((this->bounds).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->bounds).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __position._M_current =
         (this->entries).
         super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->entries).
        super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned_long,float>>,Gudhi::ripser::TParams<true,unsigned_long,float>>::diameter_entry_t,std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned_long,float>>,Gudhi::ripser::TParams<true,unsigned_long,float>>::diameter_entry_t>>
      ::
      _M_realloc_insert<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned_long,float>>,Gudhi::ripser::TParams<true,unsigned_long,float>>::diameter_entry_t_const&>
                ((vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned_long,float>>,Gudhi::ripser::TParams<true,unsigned_long,float>>::diameter_entry_t,std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,unsigned_long,float>>,Gudhi::ripser::TParams<true,unsigned_long,float>>::diameter_entry_t>>
                  *)&this->entries,__position,&local_20);
    }
    else {
      *(ulong *)&(__position._M_current)->
                 super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
           = CONCAT44(local_20.
                      super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
                      ._4_4_,local_20.
                             super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
                             .first);
      ((__position._M_current)->
      super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
      ).second.content =
           local_20.
           super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
           .second.content;
      ppdVar1 = &(this->entries).
                 super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppdVar1 = *ppdVar1 + 1;
    }
    puVar2 = (this->bounds).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish + -1;
    *puVar2 = *puVar2 + 1;
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void push_back(const ValueType e) {
    GUDHI_assert(0 < bounds.size());
    entries.push_back(e);
    ++bounds.back();
  }